

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O1

void pfx_table_notify_diff(pfx_table *new_table,pfx_table *old_table,rtr_socket *socket)

{
  pfx_update_fp p_Var1;
  long in_FS_OFFSET;
  notify_diff_cb_args args;
  pfx_table *local_58;
  pfx_table *local_50;
  rtr_socket *local_48;
  pfx_update_fp local_40;
  undefined1 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = new_table->update_fp;
  local_38 = 1;
  p_Var1 = old_table->update_fp;
  old_table->update_fp = (pfx_update_fp)0x0;
  local_58 = old_table;
  local_50 = new_table;
  local_48 = socket;
  pfx_table_for_each_ipv4_record(new_table,pfx_table_notify_diff_cb,&local_58);
  pfx_table_for_each_ipv6_record(new_table,pfx_table_notify_diff_cb,&local_58);
  local_38 = 0;
  pfx_table_for_each_ipv4_record(old_table,pfx_table_notify_diff_cb,&local_58);
  pfx_table_for_each_ipv6_record(old_table,pfx_table_notify_diff_cb,&local_58);
  old_table->update_fp = p_Var1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pfx_table_notify_diff(struct pfx_table *new_table, struct pfx_table *old_table, const struct rtr_socket *socket)
{
	pfx_update_fp old_table_fp;
	struct notify_diff_cb_args args = {old_table, new_table, socket, new_table->update_fp, true};

	// Disable update callback for old_table table
	old_table_fp = old_table->update_fp;
	old_table->update_fp = NULL;

	// Iterate new_table and try to delete every prefix from the given socket in old_table
	// If the prefix could not be removed it was added in new_table and the update cb must be called
	pfx_table_for_each_ipv4_record(new_table, pfx_table_notify_diff_cb, &args);
	pfx_table_for_each_ipv6_record(new_table, pfx_table_notify_diff_cb, &args);

	// Iterate over old_table table and search and remove remaining prefixes from the socket
	// issue a remove notification for every one of them, because they are not present in new_table.
	args.added = false;
	pfx_table_for_each_ipv4_record(old_table, pfx_table_notify_diff_cb, &args);
	pfx_table_for_each_ipv6_record(old_table, pfx_table_notify_diff_cb, &args);

	// Restore original state of old_tables update_fp
	old_table->update_fp = old_table_fp;
}